

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusionBase::mulWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *target,ImageFloat *weight)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  Image<float,_gimage::PixelTraits<float>_> *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  float *w;
  float *pn;
  float *p;
  int d;
  float *local_38;
  float *local_28;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI);
    if (iVar1 <= local_1c) break;
    pfVar2 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RSI,0,0,local_1c);
    lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
    lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    local_38 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDX,0,0,0);
    local_28 = pfVar2;
    while (local_28 < pfVar2 + lVar3 * lVar4) {
      *local_28 = *local_38 * *local_28;
      local_38 = local_38 + 1;
      local_28 = local_28 + 1;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::mulWeight(ImageFloat &target, ImageFloat &weight)
{
  for (int d=0; d<target.getDepth(); d++)
  {
    float *p=target.getPtr(0, 0, d);
    float *pn=p+target.getWidth()*target.getHeight();
    float *w=weight.getPtr(0, 0, 0);

    while (p < pn)
    {
      *p++ *= *w++;
    }
  }
}